

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_version(lys_module *module,lys_submodule *submodule,char *value,int repeat)

{
  int iVar1;
  bool bVar2;
  uint local_28;
  int ret;
  int repeat_local;
  char *value_local;
  lys_submodule *submodule_local;
  lys_module *module_local;
  
  local_28 = 0;
  if (repeat == 0) {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      if (submodule == (lys_submodule *)0x0) {
        *(ushort *)&module->field_0x40 = *(ushort *)&module->field_0x40 & 0xfff1 | 2;
      }
      else {
        bVar2 = 1 < ((byte)(*(ushort *)&module->field_0x40 >> 1) & 7);
        if (bVar2) {
          ly_vlog(module->ctx,LYE_INVER,LY_VLOG_NONE,(void *)0x0);
        }
        local_28 = (uint)bVar2;
        submodule->field_0x40 = submodule->field_0x40 & 0xf1 | 2;
      }
    }
    else {
      iVar1 = strcmp(value,"1.1");
      if (iVar1 == 0) {
        if (submodule == (lys_submodule *)0x0) {
          *(ushort *)&module->field_0x40 = *(ushort *)&module->field_0x40 & 0xfff1 | 4;
        }
        else {
          bVar2 = ((byte)(*(ushort *)&module->field_0x40 >> 1) & 7) != 2;
          if (bVar2) {
            ly_vlog(module->ctx,LYE_INVER,LY_VLOG_NONE,(void *)0x0);
          }
          local_28 = (uint)bVar2;
          submodule->field_0x40 = submodule->field_0x40 & 0xf1 | 4;
        }
      }
      else {
        ly_vlog(module->ctx,LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"yang-version");
        local_28 = 1;
      }
    }
  }
  else {
    ly_vlog(module->ctx,LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,"yang version","module");
    local_28 = 1;
  }
  free(value);
  return local_28;
}

Assistant:

int
yang_check_version(struct lys_module *module, struct lys_submodule *submodule, char *value, int repeat)
{
    int ret = EXIT_SUCCESS;

    if (repeat) {
        LOGVAL(module->ctx, LYE_TOOMANY, LY_VLOG_NONE, NULL, "yang version", "module");
        ret = EXIT_FAILURE;
    } else {
        if (!strcmp(value, "1")) {
            if (submodule) {
                if (module->version > 1) {
                    LOGVAL(module->ctx, LYE_INVER, LY_VLOG_NONE, NULL);
                    ret = EXIT_FAILURE;
                 }
                submodule->version = 1;
            } else {
                module->version = 1;
            }
        } else if (!strcmp(value, "1.1")) {
            if (submodule) {
                if (module->version != 2) {
                    LOGVAL(module->ctx, LYE_INVER, LY_VLOG_NONE, NULL);
                    ret = EXIT_FAILURE;
                }
                submodule->version = 2;
            } else {
                module->version = 2;
            }
        } else {
            LOGVAL(module->ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "yang-version");
            ret = EXIT_FAILURE;
        }
    }
    free(value);
    return ret;
}